

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createControlBarrier
          (Builder *this,Scope execution,Scope memory,MemorySemanticsMask semantics)

{
  Block *this_00;
  Id IVar1;
  Instruction *pIVar2;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  Instruction *local_28;
  Instruction *op;
  Scope local_18;
  MemorySemanticsMask semantics_local;
  Scope memory_local;
  Scope execution_local;
  Builder *this_local;
  
  op._4_4_ = semantics;
  local_18 = memory;
  semantics_local = execution;
  _memory_local = this;
  pIVar2 = (Instruction *)
           Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,execution));
  Instruction::Instruction(pIVar2,OpControlBarrier);
  local_28 = pIVar2;
  IVar1 = makeUintConstant(this,semantics_local,false);
  Instruction::addImmediateOperand(pIVar2,IVar1);
  pIVar2 = local_28;
  IVar1 = makeUintConstant(this,local_18,false);
  Instruction::addImmediateOperand(pIVar2,IVar1);
  pIVar2 = local_28;
  IVar1 = makeUintConstant(this,op._4_4_,false);
  Instruction::addImmediateOperand(pIVar2,IVar1);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_40,local_28
            );
  Block::addInstruction(this_00,local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  return;
}

Assistant:

void Builder::createControlBarrier(Scope execution, Scope memory, MemorySemanticsMask semantics)
{
    Instruction* op = new Instruction(OpControlBarrier);
    op->addImmediateOperand(makeUintConstant(execution));
    op->addImmediateOperand(makeUintConstant(memory));
    op->addImmediateOperand(makeUintConstant(semantics));
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));
}